

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::FileDescriptor::GetSourceLocation
          (FileDescriptor *this,vector<int,_std::allocator<int>_> *path,SourceLocation *out_location
          )

{
  RepeatedField<int> *this_00;
  int iVar1;
  SourceCodeInfo_Location *pSVar2;
  const_reference piVar3;
  void **ppvVar4;
  const_iterator cVar5;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  LogMessageFatal LStack_28;
  
  if (out_location == (SourceLocation *)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&LStack_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
               ,0x10be,"out_location != nullptr");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_28);
  }
  if ((this->source_code_info_ != (SourceCodeInfo *)0x0) &&
     (pSVar2 = FileDescriptorTables::GetSourceLocation(this->tables_,path,this->source_code_info_),
     pSVar2 != (SourceCodeInfo_Location *)0x0)) {
    this_00 = &(pSVar2->field_0)._impl_.span_;
    iVar1 = RepeatedField<int>::size(this_00);
    if ((iVar1 == 3) || (iVar1 = RepeatedField<int>::size(this_00), iVar1 == 4)) {
      piVar3 = RepeatedField<int>::Get(this_00,0);
      out_location->start_line = *piVar3;
      piVar3 = RepeatedField<int>::Get(this_00,1);
      out_location->start_column = *piVar3;
      iVar1 = RepeatedField<int>::size(this_00);
      piVar3 = RepeatedField<int>::Get(this_00,(uint)(iVar1 != 3) * 2);
      out_location->end_line = *piVar3;
      iVar1 = RepeatedField<int>::size(this_00);
      piVar3 = RepeatedField<int>::Get(this_00,iVar1 + -1);
      out_location->end_column = *piVar3;
      std::__cxx11::string::_M_assign((string *)&out_location->leading_comments);
      std::__cxx11::string::_M_assign((string *)&out_location->trailing_comments);
      this_01 = &(pSVar2->field_0)._impl_.leading_detached_comments_;
      ppvVar4 = internal::RepeatedPtrFieldBase::elements(&this_01->super_RepeatedPtrFieldBase);
      cVar5 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::end(this_01);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<google::protobuf::internal::RepeatedPtrIterator<std::__cxx11::string_const>>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &out_location->leading_detached_comments,ppvVar4,cVar5.it_);
      return true;
    }
  }
  return false;
}

Assistant:

bool FileDescriptor::GetSourceLocation(const std::vector<int>& path,
                                       SourceLocation* out_location) const {
  ABSL_CHECK(out_location != nullptr);
  if (source_code_info_) {
    if (const SourceCodeInfo_Location* loc =
            tables_->GetSourceLocation(path, source_code_info_)) {
      const RepeatedField<int32_t>& span = loc->span();
      if (span.size() == 3 || span.size() == 4) {
        out_location->start_line = span.Get(0);
        out_location->start_column = span.Get(1);
        out_location->end_line = span.Get(span.size() == 3 ? 0 : 2);
        out_location->end_column = span.Get(span.size() - 1);

        out_location->leading_comments = loc->leading_comments();
        out_location->trailing_comments = loc->trailing_comments();
        out_location->leading_detached_comments.assign(
            loc->leading_detached_comments().begin(),
            loc->leading_detached_comments().end());
        return true;
      }
    }
  }
  return false;
}